

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport_udp.cpp
# Opt level: O2

void __thiscall miniros::TransportUDP::enableRead(TransportUDP *this)

{
  bool bVar1;
  
  std::mutex::lock(&this->close_mutex_);
  bVar1 = this->closed_;
  pthread_mutex_unlock((pthread_mutex_t *)&this->close_mutex_);
  if ((bVar1 == false) && (this->expecting_read_ == false)) {
    PollSet::addEvents(this->poll_set_,this->sock_,1);
    this->expecting_read_ = true;
  }
  return;
}

Assistant:

void TransportUDP::enableRead()
{
  {
    std::scoped_lock<std::mutex> lock(close_mutex_);
  
    if (closed_)
    {
      return;
    }
  }

  if (!expecting_read_)
  {
    poll_set_->addEvents(sock_, POLLIN);
    expecting_read_ = true;
  }
}